

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_replicate_ghost(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS RVar2;
  void *pvVar3;
  undefined8 local_110;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GLOB *c2n;
  REF_CELL ref_cell;
  REF_INT nodes [27];
  REF_INT local_44;
  REF_INT cell_node;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT ncell;
  REF_INT group;
  REF_INT local;
  REF_GLOB global;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  global = (REF_GLOB)ref_grid->node;
  ref_mpi = (REF_MPI)ref_grid;
  uVar1 = ref_node_synchronize_globals((REF_NODE)global);
  if (uVar1 == 0) {
    if (ref_node->n < 2) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      if (ref_node->max != 0) {
        for (_group = 0; _group < *(long *)(global + 0x68); _group = _group + 1) {
          uVar1 = ref_node_add((REF_NODE)global,_group,&ncell);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x706,"ref_migrate_replicate_ghost",(ulong)uVar1,"new_node");
            return uVar1;
          }
          *(undefined4 *)(*(long *)(global + 0x28) + (long)ncell * 4) = 0;
        }
      }
      uVar1 = ref_node_ghost_real((REF_NODE)global);
      if (uVar1 == 0) {
        uVar1 = ref_geom_ghost(*(REF_GEOM *)&ref_mpi[2].native_alltoallv,(REF_NODE)global);
        if (uVar1 == 0) {
          cell = 0;
          c2n = (REF_GLOB *)ref_mpi->comm;
          while (cell < 0x10) {
            if (ref_node->max == 0) {
              new_cell = (REF_INT)c2n[5];
              uVar1 = ref_mpi_bcast((REF_MPI)ref_node,&new_cell,1,1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x711,"ref_migrate_replicate_ghost",(ulong)uVar1,"bcast");
                return uVar1;
              }
              if ((int)c2n[1] * new_cell < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x712,"ref_migrate_replicate_ghost","malloc c2n of REF_GLOB negative");
                return 1;
              }
              pvVar3 = malloc((long)((int)c2n[1] * new_cell) << 3);
              if (pvVar3 == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x712,"ref_migrate_replicate_ghost","malloc c2n of REF_GLOB NULL");
                return 2;
              }
              new_cell = 0;
              for (cell_node = 0; cell_node < *(int *)((long)c2n + 0x2c); cell_node = cell_node + 1)
              {
                RVar2 = ref_cell_nodes((REF_CELL)c2n,cell_node,(REF_INT *)&ref_cell);
                if (RVar2 == 0) {
                  for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)c2n + 0xc);
                      nodes[0x1a] = nodes[0x1a] + 1) {
                    if (((nodes[(long)nodes[0x1a] + -2] < 0) ||
                        (*(int *)(global + 4) <= nodes[(long)nodes[0x1a] + -2])) ||
                       (*(long *)(*(long *)(global + 0x10) + (long)nodes[(long)nodes[0x1a] + -2] * 8
                                 ) < 0)) {
                      local_110 = 0xffffffffffffffff;
                    }
                    else {
                      local_110 = *(undefined8 *)
                                   (*(long *)(global + 0x10) +
                                   (long)nodes[(long)nodes[0x1a] + -2] * 8);
                    }
                    *(undefined8 *)((long)pvVar3 + (long)(nodes[0x1a] + (int)c2n[1] * new_cell) * 8)
                         = local_110;
                  }
                  if (*(int *)((long)c2n + 4) != 0) {
                    *(long *)((long)pvVar3 +
                             (long)(*(int *)((long)c2n + 0xc) + (int)c2n[1] * new_cell) * 8) =
                         (long)nodes[(long)*(int *)((long)c2n + 0xc) + -2];
                  }
                  new_cell = new_cell + 1;
                }
              }
              if ((long)new_cell != (long)(int)c2n[5]) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x721,"ref_migrate_replicate_ghost","ncell miscount",(long)new_cell,
                       (long)(int)c2n[5]);
                return 1;
              }
              uVar1 = ref_mpi_bcast((REF_MPI)ref_node,pvVar3,new_cell * (int)c2n[1],2);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x724,"ref_migrate_replicate_ghost",(ulong)uVar1,"bcast");
                return uVar1;
              }
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              uVar1 = ref_mpi_bcast((REF_MPI)ref_node,&new_cell,1,1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x727,"ref_migrate_replicate_ghost",(ulong)uVar1,"bcast");
                return uVar1;
              }
              if ((int)c2n[1] * new_cell < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x728,"ref_migrate_replicate_ghost","malloc c2n of REF_GLOB negative");
                return 1;
              }
              pvVar3 = malloc((long)((int)c2n[1] * new_cell) << 3);
              if (pvVar3 == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x728,"ref_migrate_replicate_ghost","malloc c2n of REF_GLOB NULL");
                return 2;
              }
              uVar1 = ref_mpi_bcast((REF_MPI)ref_node,pvVar3,new_cell * (int)c2n[1],2);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x72b,"ref_migrate_replicate_ghost",(ulong)uVar1,"bcast");
                return uVar1;
              }
              for (cell_node = 0; cell_node < new_cell; cell_node = cell_node + 1) {
                for (nodes[0x1a] = 0; nodes[0x1a] < *(int *)((long)c2n + 0xc);
                    nodes[0x1a] = nodes[0x1a] + 1) {
                  uVar1 = ref_node_local((REF_NODE)global,
                                         *(REF_GLOB *)
                                          ((long)pvVar3 +
                                          (long)(nodes[0x1a] + cell_node * (int)c2n[1]) * 8),
                                         nodes + (long)nodes[0x1a] + -2);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x732,"ref_migrate_replicate_ghost",(ulong)uVar1,"g2l");
                    return uVar1;
                  }
                }
                if (*(int *)((long)c2n + 4) != 0) {
                  nodes[(long)*(int *)((long)c2n + 0xc) + -2] =
                       (REF_INT)*(undefined8 *)
                                 ((long)pvVar3 +
                                 (long)(*(int *)((long)c2n + 0xc) + (int)c2n[1] * cell_node) * 8);
                }
                uVar1 = ref_cell_add((REF_CELL)c2n,(REF_INT *)&ref_cell,&local_44);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x739,"ref_migrate_replicate_ghost",(ulong)uVar1,"add cell");
                  return uVar1;
                }
              }
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            cell = cell + 1;
            c2n = (REF_GLOB *)(&ref_mpi->comm)[cell];
          }
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x70c,"ref_migrate_replicate_ghost",(ulong)uVar1,"ghost geom");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x70b,"ref_migrate_replicate_ghost",(ulong)uVar1,"ghost real");
        ref_grid_local._4_4_ = uVar1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x700
           ,"ref_migrate_replicate_ghost",(ulong)uVar1,"sync global nodes");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_replicate_ghost(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GLOB global;
  REF_INT local;
  REF_INT group, ncell, cell, new_cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_CELL ref_cell;
  REF_GLOB *c2n;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  if (!ref_mpi_once(ref_mpi)) {
    for (global = 0; global < ref_node_n_global(ref_node); global++) {
      RSS(ref_node_add(ref_node, global, &local), "new_node");
      ref_node_part(ref_node, local) = 0;
    }
  }

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  RSS(ref_geom_ghost(ref_grid_geom(ref_grid), ref_node), "ghost geom");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (ref_mpi_once(ref_mpi)) {
      ncell = ref_cell_n(ref_cell);
      RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_INT_TYPE), "bcast");
      ref_malloc(c2n, ref_cell_size_per(ref_cell) * ncell, REF_GLOB);
      ncell = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
             cell_node++) {
          c2n[cell_node + ref_cell_size_per(ref_cell) * ncell] =
              ref_node_global(ref_node, nodes[cell_node]);
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          c2n[ref_cell_id_index(ref_cell) +
              ref_cell_size_per(ref_cell) * ncell] =
              (REF_GLOB)nodes[ref_cell_id_index(ref_cell)];
        }
        ncell++;
      }
      REIS(ncell, ref_cell_n(ref_cell), "ncell miscount");
      RSS(ref_mpi_bcast(ref_mpi, c2n, ncell * ref_cell_size_per(ref_cell),
                        REF_GLOB_TYPE),
          "bcast");
      ref_free(c2n);
    } else {
      RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_INT_TYPE), "bcast");
      ref_malloc(c2n, ref_cell_size_per(ref_cell) * ncell, REF_GLOB);
      RSS(ref_mpi_bcast(ref_mpi, c2n, ncell * ref_cell_size_per(ref_cell),
                        REF_GLOB_TYPE),
          "bcast");
      for (cell = 0; cell < ncell; cell++) {
        for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
             cell_node++) {
          RSS(ref_node_local(
                  ref_node, c2n[cell_node + cell * ref_cell_size_per(ref_cell)],
                  &(nodes[cell_node])),
              "g2l");
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          nodes[ref_cell_id_index(ref_cell)] =
              (REF_INT)c2n[ref_cell_id_index(ref_cell) +
                           ref_cell_size_per(ref_cell) * cell];
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add cell");
      }
      ref_free(c2n);
    }
  }

  return REF_SUCCESS;
}